

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaBinrIO.cpp
# Opt level: O2

void __thiscall NaBinaryStreamFile::AppendRecord(NaBinaryStreamFile *this)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  undefined4 *puVar4;
  
  iVar2 = fseek((FILE *)this->fp,0,2);
  if (iVar2 == 0) {
    if (this->iCurLine == -1) {
      lVar3 = 0;
    }
    else {
      fwrite(this->vCurLine,this->nDataSize,(long)this->nVar,(FILE *)this->fp);
      lVar3 = this->iCurLine + 1;
    }
    this->iCurLine = lVar3;
    plVar1 = &(this->super_NaDataFile).nRecords;
    *plVar1 = *plVar1 + 1;
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 8;
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

void
NaBinaryStreamFile::AppendRecord ()
{
  if(0 != fseek(fp, 0, SEEK_END))
    throw(na_write_error);

  if(-1 != iCurLine)
    fwrite(vCurLine, nDataSize, nVar, fp);

  ++iCurLine;
  ++nRecords;
}